

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_avl.c
# Opt level: O3

void do_tests(_Bool do_random)

{
  list_entity **pplVar1;
  int iVar2;
  undefined1 *puVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  list_entity *plVar7;
  list_entity *plVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  undefined1 uVar13;
  char *pcVar14;
  undefined7 in_register_00000039;
  uint uVar15;
  uint uVar16;
  tree_element *ptVar17;
  uint32_t i;
  uint32_t i_1;
  uint local_6c;
  tree_element *local_68;
  list_entity *local_60;
  long local_58;
  long local_50;
  long local_48;
  undefined8 local_40;
  undefined4 local_38;
  undefined4 local_34;
  
  uVar12 = CONCAT71(in_register_00000039,do_random);
  pcVar14 = "non ";
  if ((uint)uVar12 != 0) {
    pcVar14 = "";
  }
  printf("Do %srandom tests.\n",pcVar14);
  cunit_start_test("test_insert_nondup");
  uVar13 = 0x28;
  avl_init(&head,avl_comp_uint32,0);
  add_elements((tree_element *)(uVar12 & 0xffffffff),(_Bool)uVar13);
  cunit_named_check(head.count == 6,"test_insert_nondup",0xef,"tree not completely filled");
  check_tree("test_insert_nondup",0xf0);
  ptVar17 = nodes;
  additional_node1.value = nodes[3].value;
  additional_node1.node.key = &additional_node1;
  iVar2 = avl_insert(&head,0x108278);
  cunit_named_check(iVar2 != 0,"test_insert_nondup",0xf6,
                    "insert duplicate (in non-dup tree) was successful");
  cunit_named_check(head.count == 6,"test_insert_nondup",0xf8,
                    "tree not completely filled after insert");
  check_tree("test_insert_nondup",0xf9);
  cunit_end_test("test_insert_nondup");
  cunit_start_test("test_insert_dup");
  uVar13 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(uVar12 & 0xffffffff),(_Bool)uVar13);
  cunit_named_check(head.count == 6,"test_insert_dup",0x103,"tree not completely filled");
  check_tree("test_insert_dup",0x104);
  additional_node1.value = nodes[3].value;
  additional_node1.node.key = &additional_node1;
  iVar2 = avl_insert(&head,0x108278);
  cunit_named_check(iVar2 == 0,"test_insert_dup",0x10a,
                    "insert duplicate (in dup tree) was not successful");
  cunit_named_check(head.count == 7,"test_insert_dup",0x10d,
                    "tree not completely filled after insert");
  check_tree("test_insert_dup",0x10e);
  cunit_end_test("test_insert_dup");
  cunit_start_test("test_find");
  uVar13 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(uVar12 & 0xffffffff),(_Bool)uVar13);
  uVar9 = 0;
  do {
    puVar3 = (undefined1 *)avl_find(&head,ptVar17);
    cunit_named_check(&ptVar17->node == (avl_node *)puVar3,"test_find",0x11d,
                      "node of element %d not found",uVar9 & 0xffffffff);
    lVar4 = avl_find(&head,ptVar17);
    cunit_named_check(ptVar17 == (tree_element *)(lVar4 + -8) && lVar4 != 0,"test_find",0x11e,
                      "element %d not found",uVar9 & 0xffffffff);
    uVar9 = uVar9 + 1;
    ptVar17 = ptVar17 + 1;
  } while (uVar9 != 6);
  local_6c = 0xff;
  lVar4 = avl_find(&head,&local_6c);
  cunit_named_check(lVar4 == 0,"test_find",0x121,"non-existing element found: %d",(ulong)local_6c);
  additional_node1.value = nodes[3].value;
  additional_node1.node.key = &additional_node1;
  iVar2 = avl_insert(&head,0x108278);
  cunit_named_check(iVar2 == 0,"test_find",0x126,"insert duplicate (in dup tree) was not successful"
                   );
  local_6c = 0;
  do {
    lVar4 = avl_find(&head,nodes + local_6c);
    cunit_named_check(lVar4 != 0,"test_find",0x12a,"element %d not found",(ulong)local_6c);
    local_6c = local_6c + 1;
  } while (local_6c < 6);
  local_6c = 0xff;
  lVar4 = avl_find(&head,&local_6c);
  uVar16 = 0;
  cunit_named_check(lVar4 == 0,"test_find",0x12d,"non-existing element found: %d",(ulong)local_6c);
  cunit_end_test("test_find");
  cunit_start_test("test_delete_nondup");
  uVar13 = 0x28;
  avl_init(&head,avl_comp_uint32,0);
  add_elements((tree_element *)(ulong)do_random,(_Bool)uVar13);
  local_40 = 0x108178;
  avl_remove(&head);
  cunit_named_check(head.count == 5,"test_delete_nondup",0x139,"tree has wrong count after delete");
  check_tree("test_delete_nondup",0x13a);
  cunit_end_test("test_delete_nondup");
  cunit_start_test("test_delete_dup");
  uVar10 = 1;
  uVar13 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  uVar15 = (uint)uVar12 & 0xff;
  add_elements((tree_element *)(ulong)do_random,(_Bool)uVar13);
  local_58 = 0x1081b0;
  additional_node1.value = nodes[3].value;
  additional_node1.node.key = &additional_node1;
  local_48 = 0x108278;
  iVar2 = avl_insert(&head);
  cunit_named_check(iVar2 == 0,"test_delete_dup",0x148,
                    "insert duplicate (in dup tree) was not successful");
  local_50 = 0x1081b8;
  avl_remove(&head);
  cunit_named_check(head.count == 6,"test_delete_dup",0x14b,
                    "tree has wrong count after delete of one duplicate");
  check_tree("test_delete_dup",0x14c);
  cunit_end_test("test_delete_dup");
  cunit_start_test("test_greaterequal");
  uVar13 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)uVar15,(_Bool)uVar13);
  avl_remove(&head,local_40);
  local_38 = 2;
  lVar4 = avl_find_greaterequal(&head,&local_38);
  local_60 = &nodes[1].node.list;
  cunit_named_check(lVar4 == 0x108138,"test_greaterequal",0x15c,"node of element >= 2 not found");
  lVar4 = avl_find_greaterequal(&head,&local_38);
  local_68 = nodes + 1;
  cunit_named_check(lVar4 == 0x108138,"test_greaterequal",0x15d,"element >= 2 not found");
  local_38 = 3;
  lVar4 = avl_find_greaterequal(&head,&local_38);
  lVar6 = local_50;
  cunit_named_check(lVar4 == local_50,"test_greaterequal",0x161,"node of element >= 3 not found");
  lVar5 = avl_find_greaterequal(&head,&local_38);
  lVar4 = local_58;
  cunit_named_check(lVar5 + -8 == local_58 && lVar5 != 0,"test_greaterequal",0x162,
                    "element >= 3 not found");
  local_38 = 4;
  lVar5 = avl_find_greaterequal(&head,&local_38);
  cunit_named_check(lVar5 == lVar6,"test_greaterequal",0x166,"node of element >= 4 not found");
  lVar6 = avl_find_greaterequal(&head,&local_38);
  cunit_named_check(lVar6 + -8 == lVar4 && lVar6 != 0,"test_greaterequal",0x167,
                    "element >= 4 not found");
  local_38 = 0xff;
  lVar4 = avl_find_greaterequal(&head,&local_38);
  cunit_named_check(lVar4 == 0,"test_greaterequal",0x16b,"node of element >= 255 found");
  lVar4 = avl_find_greaterequal(&head,&local_38);
  cunit_named_check(lVar4 == 0,"test_greaterequal",0x16c,"element >= 255 found");
  additional_node1.value = 4;
  additional_node1.node.key = &additional_node1;
  avl_insert(&head,local_48);
  local_38 = 2;
  plVar7 = (list_entity *)avl_find_greaterequal(&head,&local_38);
  cunit_named_check(plVar7 == local_60,"test_greaterequal",0x175,
                    "node of element >= 2 not found (d)");
  lVar4 = avl_find_greaterequal(&head,&local_38);
  cunit_named_check((tree_element *)(lVar4 + -8) == local_68 && lVar4 != 0,"test_greaterequal",0x176
                    ,"element >= 2 not found (d)");
  local_38 = 3;
  lVar4 = avl_find_greaterequal(&head,&local_38);
  lVar6 = local_50;
  cunit_named_check(lVar4 == local_50,"test_greaterequal",0x17a,"node of element >= 3 not found (d)"
                   );
  lVar5 = avl_find_greaterequal(&head,&local_38);
  lVar4 = local_58;
  cunit_named_check(lVar5 + -8 == local_58 && lVar5 != 0,"test_greaterequal",0x17b,
                    "element >= 3 not found (d)");
  local_38 = 4;
  lVar5 = avl_find_greaterequal(&head,&local_38);
  cunit_named_check(lVar5 == lVar6,"test_greaterequal",0x17f,"node of element >= 4 not found (d)");
  lVar6 = avl_find_greaterequal(&head,&local_38);
  cunit_named_check(lVar6 + -8 == lVar4 && lVar6 != 0,"test_greaterequal",0x180,
                    "element >= 4 not found (d)");
  local_38 = 0xff;
  lVar4 = avl_find_greaterequal(&head,&local_38);
  cunit_named_check(lVar4 == 0,"test_greaterequal",0x184,"node of element >= 255 found (d)");
  lVar4 = avl_find_greaterequal(&head,&local_38);
  cunit_named_check(lVar4 == 0,"test_greaterequal",0x185,"element >= 255 found (d)");
  cunit_end_test("test_greaterequal");
  cunit_start_test("test_lessequal");
  uVar13 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)uVar15,(_Bool)uVar13);
  avl_remove(&head,local_40);
  local_34 = 0;
  lVar4 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar4 == 0,"test_lessequal",0x195,"node of element <= 0 found");
  lVar4 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar4 == 0,"test_lessequal",0x196,"element <= 0 found");
  local_34 = 2;
  plVar8 = (list_entity *)avl_find_lessequal(&head,&local_34);
  plVar7 = local_60;
  cunit_named_check(plVar8 == local_60,"test_lessequal",0x19a,"node of element <= 2 not found");
  lVar4 = avl_find_lessequal(&head,&local_34);
  ptVar17 = local_68;
  cunit_named_check((tree_element *)(lVar4 + -8) == local_68 && lVar4 != 0,"test_lessequal",0x19b,
                    "element <= 2 not found");
  local_34 = 3;
  plVar8 = (list_entity *)avl_find_lessequal(&head,&local_34);
  cunit_named_check(plVar8 == plVar7,"test_lessequal",0x19f,"node of element <= 3 not found");
  lVar4 = avl_find_lessequal(&head,&local_34);
  cunit_named_check((tree_element *)(lVar4 + -8) == ptVar17 && lVar4 != 0,"test_lessequal",0x1a0,
                    "element <= 3 not found");
  local_34 = 4;
  lVar4 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar4 == local_50,"test_lessequal",0x1a4,"node of element <= 4 not found");
  lVar4 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar4 + -8 == local_58 && lVar4 != 0,"test_lessequal",0x1a5,
                    "element <= 4 not found");
  additional_node1.value = 4;
  additional_node1.node.key = &additional_node1;
  avl_insert(&head,local_48);
  local_34 = 0;
  lVar4 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar4 == 0,"test_lessequal",0x1ae,"node of element <= 0 found (d)");
  lVar4 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar4 == 0,"test_lessequal",0x1af,"element <= 0 found (d)");
  local_34 = 2;
  plVar8 = (list_entity *)avl_find_lessequal(&head,&local_34);
  plVar7 = local_60;
  cunit_named_check(plVar8 == local_60,"test_lessequal",0x1b3,"node of element <= 2 not found (d)");
  lVar4 = avl_find_lessequal(&head,&local_34);
  ptVar17 = local_68;
  cunit_named_check((tree_element *)(lVar4 + -8) == local_68 && lVar4 != 0,"test_lessequal",0x1b4,
                    "element <= 2 not found (d)");
  local_34 = 3;
  plVar8 = (list_entity *)avl_find_lessequal(&head,&local_34);
  cunit_named_check(plVar8 == plVar7,"test_lessequal",0x1b8,"node of element <= 3 not found (d)");
  lVar4 = avl_find_lessequal(&head,&local_34);
  cunit_named_check((tree_element *)(lVar4 + -8) == ptVar17 && lVar4 != 0,"test_lessequal",0x1b9,
                    "element <= 3 not found (d)");
  local_34 = 4;
  lVar4 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar4 == local_48,"test_lessequal",0x1bd,
                    "node of element <= 4 not found correctly (d)");
  lVar4 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar4 == 0x108278,"test_lessequal",0x1be,"element <= 4 not found correctly (d)")
  ;
  cunit_end_test("test_lessequal");
  cunit_start_test("test_conditions");
  avl_init(&head,avl_comp_uint32,1);
  uVar13 = 0x19;
  cunit_named_check(head.count == 0,"test_conditions",0x1c7,"tree should be empty");
  add_elements((tree_element *)(ulong)uVar15,(_Bool)uVar13);
  cunit_named_check(head.count != 0,"test_conditions",0x1ca,"tree should not be empty");
  cunit_named_check((avl_node *)head.list_head.next == &nodes[0].node,"test_conditions",0x1cc,
                    "element 1 should be first");
  cunit_named_check(head.list_head.next != local_60,"test_conditions",0x1cd,
                    "element 2 should not be first");
  cunit_named_check((avl_node *)head.list_head.prev == &nodes[5].node,"test_conditions",0x1cf,
                    "element %d should be first",6);
  cunit_named_check((avl_node *)head.list_head.prev != &nodes[0].node,"test_conditions",0x1d0,
                    "element 1 should not be first");
  cunit_end_test("test_conditions");
  cunit_start_test("test_element_functions");
  uVar13 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)uVar15,(_Bool)uVar13);
  cunit_named_check((avl_node *)head.list_head.next == &nodes[0].node,"test_element_functions",0x1dc
                    ,"Element 1 should be first");
  cunit_named_check((avl_node *)head.list_head.prev == &nodes[5].node,"test_element_functions",0x1dd
                    ,"Element %d should be first",6);
  ptVar17 = local_68;
  cunit_named_check((tree_element *)&nodes[0].node.list.next[-1].prev == local_68,
                    "test_element_functions",0x1df,"Element 2 is not next of element 1");
  cunit_named_check((tree_element *)&nodes[2].node.list.prev[-1].prev == ptVar17,
                    "test_element_functions",0x1e0,"Element 2 is not prev of element 3");
  cunit_end_test("test_element_functions");
  cunit_start_test("test_for_each_macros");
  uVar13 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)uVar15,(_Bool)uVar13);
  if ((head.list_head.next)->prev != head.list_head.prev) {
    uVar16 = 0;
    plVar7 = head.list_head.next;
    do {
      cunit_named_check((tree_element *)&plVar7[-1].prev == nodes + uVar16,"test_for_each_macros",
                        0x1ee,"for_each iteration %d failed",(ulong)uVar16);
      uVar16 = uVar16 + 1;
      plVar7 = plVar7->next;
    } while (plVar7->prev != head.list_head.prev);
  }
  cunit_named_check(uVar16 == 6,"test_for_each_macros",0x1f1,"for_each only had %d of %d iterations"
                    ,(ulong)uVar16,6);
  if ((avl_node *)nodes[1].node.list.prev != &nodes[4].node) {
    uVar12 = 1;
    ptVar17 = (tree_element *)0x108130;
    do {
      cunit_named_check(ptVar17 == nodes + uVar12,"test_for_each_macros",0x1f5,
                        "for_element_range iteration %d failed",uVar12);
      uVar10 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar10;
      plVar7 = (ptVar17->node).list.next;
      ptVar17 = (tree_element *)&plVar7[-1].prev;
    } while (plVar7->prev != (list_entity *)0x1081f8);
  }
  uVar16 = 0;
  cunit_named_check(uVar10 == 5,"test_for_each_macros",0x1f8,
                    "for_element_range only had %d of %d iterations",(ulong)(uVar10 - 1),4);
  if (nodes[1].node.list.prev == head.list_head.prev) {
    uVar10 = 1;
  }
  else {
    uVar12 = 1;
    ptVar17 = (tree_element *)0x108130;
    do {
      cunit_named_check(ptVar17 == nodes + uVar12,"test_for_each_macros",0x1fc,
                        "element_to_last iteration %d failed",uVar12);
      uVar10 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar10;
      plVar7 = (ptVar17->node).list.next;
      ptVar17 = (tree_element *)&plVar7[-1].prev;
    } while (plVar7->prev != head.list_head.prev);
  }
  cunit_named_check(uVar10 == 6,"test_for_each_macros",0x1ff,
                    "element_to_last only had %d of %d iterations",(ulong)(uVar10 - 1),5);
  if ((avl_node *)(head.list_head.next)->prev != &nodes[4].node) {
    uVar12 = 0;
    plVar7 = head.list_head.next;
    do {
      cunit_named_check((tree_element *)&plVar7[-1].prev == nodes + uVar12,"test_for_each_macros",
                        0x203,"first_to_element iteration %d failed",uVar12);
      uVar16 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar16;
      plVar7 = plVar7->next;
    } while ((avl_node *)plVar7->prev != &nodes[4].node);
  }
  uVar11 = 0;
  uVar12 = 5;
  cunit_named_check(uVar16 == 5,"test_for_each_macros",0x206,
                    "first_to_element only had %d of %d iterations",(ulong)(uVar16 - 1),5);
  cunit_end_test("test_for_each_macros");
  cunit_start_test("test_for_each_reverse_macros");
  uVar13 = 0x28;
  uVar10 = 1;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)uVar15,(_Bool)uVar13);
  if ((head.list_head.prev)->next != head.list_head.next) {
    uVar11 = 0;
    plVar7 = head.list_head.prev;
    do {
      cunit_named_check((tree_element *)&plVar7[-1].prev == nodes + uVar12,
                        "test_for_each_reverse_macros",0x215,"for_each iteration %d failed",
                        (ulong)uVar11);
      uVar11 = uVar11 + 1;
      uVar12 = (ulong)((int)uVar12 - 1);
      plVar7 = plVar7->prev;
    } while (plVar7->next != head.list_head.next);
  }
  cunit_named_check(uVar11 == 6,"test_for_each_reverse_macros",0x219,
                    "for_each only had %d of %d iterations",(ulong)uVar11,6);
  if ((avl_node *)nodes[4].node.list.next != &nodes[1].node) {
    uVar16 = 4;
    uVar10 = 1;
    ptVar17 = nodes + 4;
    do {
      cunit_named_check(ptVar17 == nodes + uVar16,"test_for_each_reverse_macros",0x21e,
                        "for_element_range iteration %d failed",(ulong)uVar10);
      uVar10 = uVar10 + 1;
      uVar16 = uVar16 - 1;
      plVar7 = (ptVar17->node).list.prev;
      ptVar17 = (tree_element *)&plVar7[-1].prev;
    } while (plVar7->next != (list_entity *)0x108138);
  }
  uVar16 = 0;
  cunit_named_check(uVar10 == 5,"test_for_each_reverse_macros",0x222,
                    "for_element_range only had %d of %d iterations",(ulong)(uVar10 - 1),4);
  if ((head.list_head.prev)->next == (list_entity *)0x108138) {
    uVar10 = 1;
  }
  else {
    uVar12 = 5;
    uVar10 = 1;
    plVar7 = head.list_head.prev;
    do {
      cunit_named_check((tree_element *)&plVar7[-1].prev == nodes + uVar12,
                        "test_for_each_reverse_macros",0x227,"element_to_last iteration %d failed",
                        (ulong)uVar10);
      uVar10 = uVar10 + 1;
      uVar12 = (ulong)((int)uVar12 - 1);
      plVar7 = plVar7->prev;
    } while (plVar7->next != (list_entity *)0x108138);
  }
  cunit_named_check(uVar10 == 6,"test_for_each_reverse_macros",0x22b,
                    "element_to_last only had %d of %d iterations",(ulong)(uVar10 - 1),5);
  if (nodes[4].node.list.next != head.list_head.next) {
    uVar12 = 4;
    ptVar17 = nodes + 4;
    uVar16 = 0;
    do {
      cunit_named_check(ptVar17 == nodes + uVar12,"test_for_each_reverse_macros",0x230,
                        "first_to_element iteration %d failed",(ulong)uVar16);
      uVar16 = uVar16 + 1;
      uVar12 = (ulong)((int)uVar12 - 1);
      plVar7 = (ptVar17->node).list.prev;
      ptVar17 = (tree_element *)&plVar7[-1].prev;
    } while (plVar7->next != head.list_head.next);
  }
  uVar10 = 0;
  cunit_named_check(uVar16 == 5,"test_for_each_reverse_macros",0x234,
                    "first_to_element only had %d of %d iterations",(ulong)(uVar16 - 1),5);
  cunit_end_test("test_for_each_reverse_macros");
  cunit_start_test("test_for_each_save_macro");
  uVar13 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)uVar15,(_Bool)uVar13);
  uVar12 = 0;
  if ((head.list_head.next)->prev != head.list_head.prev) {
    uVar12 = 0;
    plVar7 = head.list_head.next;
    do {
      plVar8 = plVar7->next;
      cunit_named_check((tree_element *)&plVar7[-1].prev == nodes + uVar12,
                        "test_for_each_save_macro",0x243,"for_each_save iteration %d failed",uVar12)
      ;
      avl_remove(&head,plVar7);
      uVar12 = (ulong)((int)uVar12 + 1);
      plVar7 = plVar8;
    } while (plVar8->prev != head.list_head.prev);
  }
  cunit_named_check((int)uVar12 == 6,"test_for_each_save_macro",0x247,
                    "for_each_save only had %d of %d iterations",uVar12,6);
  cunit_named_check(head.count == 0,"test_for_each_save_macro",0x248,
                    "for_each_save tree not empty after loop with delete");
  cunit_end_test("test_for_each_save_macro");
  cunit_start_test("test_for_each_reverse_save_macro");
  uVar13 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)uVar15,(_Bool)uVar13);
  if ((head.list_head.prev)->next != head.list_head.next) {
    uVar12 = 5;
    uVar10 = 0;
    plVar7 = head.list_head.prev;
    do {
      plVar8 = plVar7->prev;
      cunit_named_check((tree_element *)&plVar7[-1].prev == nodes + uVar12,
                        "test_for_each_reverse_save_macro",599,"for_each_save iteration %d failed",
                        (ulong)uVar10);
      avl_remove(&head,plVar7);
      uVar10 = uVar10 + 1;
      uVar12 = (ulong)((int)uVar12 - 1);
      plVar7 = plVar8;
    } while (plVar8->next != head.list_head.next);
  }
  uVar16 = 0;
  cunit_named_check(uVar10 == 6,"test_for_each_reverse_save_macro",0x25c,
                    "for_each_save only had %d of %d iterations",(ulong)uVar10,6);
  cunit_named_check(head.count == 0,"test_for_each_reverse_save_macro",0x25d,
                    "for_each_save tree not empty after loop with delete");
  cunit_end_test("test_for_each_reverse_save_macro");
  cunit_start_test("test_remove_all_macro");
  uVar13 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)uVar15,(_Bool)uVar13);
  plVar7 = head.list_head.next;
  pplVar1 = &(head.list_head.next)->next;
  head.list_head.prev = &head.list_head;
  head.list_head.next = &head.list_head;
  head.root = (avl_node *)0x0;
  if (head.count != 0) {
    uVar12 = 0;
    plVar8 = *pplVar1;
    do {
      cunit_named_check((tree_element *)&plVar7[-1].prev == nodes + uVar12,"test_remove_all_macro",
                        0x26b,"for_each_save iteration %u failed",uVar12);
      uVar16 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar16;
      head.count = head.count - 1;
      plVar7 = plVar8;
      plVar8 = plVar8->next;
    } while (head.count != 0);
  }
  cunit_named_check(uVar16 == 6,"test_remove_all_macro",0x26e,
                    "remove_all only had %u of %u iterations",(ulong)uVar16,6);
  cunit_named_check(head.count == 0,"test_remove_all_macro",0x26f,
                    "remove_all tree not empty after loop with delete");
  check_tree("test_remove_all_macro",0x271);
  cunit_end_test("test_remove_all_macro");
  return;
}

Assistant:

static void do_tests(bool do_random) {
  printf("Do %srandom tests.\n", do_random ? "" : "non ");

  test_insert_nondup(do_random);
  test_insert_dup(do_random);
  test_find(do_random);
  test_delete_nondup(do_random);
  test_delete_dup(do_random);
  test_greaterequal(do_random);
  test_lessequal(do_random);
  test_conditions(do_random);
  test_element_functions(do_random);
  test_for_each_macros(do_random);
  test_for_each_reverse_macros(do_random);
  test_for_each_save_macro(do_random);
  test_for_each_reverse_save_macro(do_random);
  test_remove_all_macro(do_random);
}